

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal-utils.h
# Opt level: O1

Expression * wasm::LiteralUtils::makeZero(Type type,Module *wasm)

{
  bool bVar1;
  Const *pCVar2;
  Unary *this;
  Literals local_58;
  Type local_20;
  Builder builder;
  
  local_20.id = type.id;
  bVar1 = wasm::Type::isDefaultable(&local_20);
  if (bVar1) {
    local_20.id = (uintptr_t)wasm;
    if (type.id == 6) {
      pCVar2 = Builder::makeConst<int>((Builder *)&local_20,0);
      this = (Unary *)MixedArena::allocSpace((MixedArena *)(local_20.id + 0x200),0x20,8);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
      this->op = SplatVecI32x4;
      this->value = (Expression *)pCVar2;
      Unary::finalize(this);
    }
    else {
      Literal::makeZeros(&local_58,type);
      this = (Unary *)Builder::makeConstantExpression((Builder *)&local_20,&local_58);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                (&local_58.super_SmallVector<wasm::Literal,_1UL>.flexible);
      Literal::~Literal(local_58.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    }
    return (Expression *)this;
  }
  __assert_fail("canMakeZero(type)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/literal-utils.h"
                ,0x23,"Expression *wasm::LiteralUtils::makeZero(Type, Module &)");
}

Assistant:

inline Expression* makeZero(Type type, Module& wasm) {
  assert(canMakeZero(type));
  // TODO: Remove this function once V8 supports v128.const
  // (https://bugs.chromium.org/p/v8/issues/detail?id=8460)
  Builder builder(wasm);
  if (type == Type::v128) {
    return builder.makeUnary(SplatVecI32x4, builder.makeConst(int32_t(0)));
  }
  return builder.makeConstantExpression(Literal::makeZeros(type));
}